

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

CodeLocation __thiscall soul::CodeLocation::getStartOfPreviousLine(CodeLocation *this)

{
  bool bVar1;
  char *pcVar2;
  SourceCodeText *pSVar3;
  UTF8Reader extraout_RDX;
  RefCountedPtr<soul::SourceCodeText> *in_RSI;
  CodeLocation CVar4;
  UTF8Reader local_50 [3];
  UTF8Reader local_38;
  undefined4 local_2c;
  undefined1 local_28 [8];
  CodeLocation l;
  CodeLocation *this_local;
  
  getStartOfLine((CodeLocation *)local_28);
  pcVar2 = UTF8Reader::getAddress((UTF8Reader *)&l);
  if (pcVar2 == (char *)0x0) {
    memset(this,0,0x10);
    CodeLocation(this);
  }
  else {
    pSVar3 = RefCountedPtr<soul::SourceCodeText>::operator->(in_RSI);
    UTF8Reader::UTF8Reader(&local_38,&pSVar3->utf8);
    bVar1 = UTF8Reader::operator<=((UTF8Reader *)&l,&local_38);
    if (bVar1) {
      memset(this,0,0x10);
      CodeLocation(this);
    }
    else {
      UTF8Reader::operator--(local_50);
      getStartOfLine(this);
    }
  }
  local_2c = 1;
  ~CodeLocation((CodeLocation *)local_28);
  CVar4.location.data = extraout_RDX.data;
  CVar4.sourceCode.object = (SourceCodeText *)this;
  return CVar4;
}

Assistant:

CodeLocation CodeLocation::getStartOfPreviousLine() const
{
    auto l = getStartOfLine();

    if (l.location.getAddress() == nullptr)
        return {};

    if (l.location <= sourceCode->utf8)
        return {};

    --(l.location);
    return l.getStartOfLine();
}